

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlChar * xmlBuildQName(xmlChar *ncname,xmlChar *prefix,xmlChar *memory,int len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  
  if (ncname == (xmlChar *)0x0) {
LAB_0014ad0c:
    memory = (xmlChar *)0x0;
  }
  else {
    if (prefix == (xmlChar *)0x0) {
      return ncname;
    }
    sVar3 = strlen((char *)ncname);
    sVar4 = strlen((char *)prefix);
    iVar1 = (int)sVar3;
    iVar2 = (int)sVar4;
    if ((memory == (xmlChar *)0x0) || (len < iVar1 + iVar2 + 2)) {
      lVar5 = (ulong)(uint)(iVar1 + iVar2) << 0x20;
      memory = (xmlChar *)(*xmlMalloc)(lVar5 + 0x200000000 >> 0x20);
      if (memory == (xmlChar *)0x0) goto LAB_0014ad0c;
    }
    else {
      lVar5 = (ulong)(uint)(iVar1 + iVar2) << 0x20;
    }
    memcpy(memory,prefix,(long)iVar2);
    memory[iVar2] = ':';
    memcpy(memory + (iVar2 + 1),ncname,(long)iVar1);
    memory[lVar5 + 0x100000000 >> 0x20] = '\0';
  }
  return memory;
}

Assistant:

xmlChar *
xmlBuildQName(const xmlChar *ncname, const xmlChar *prefix,
	      xmlChar *memory, int len) {
    int lenn, lenp;
    xmlChar *ret;

    if (ncname == NULL) return(NULL);
    if (prefix == NULL) return((xmlChar *) ncname);

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    /* Make allocation more likely */
    if (len > 8)
        len = 8;
#endif

    lenn = strlen((char *) ncname);
    lenp = strlen((char *) prefix);

    if ((memory == NULL) || (len < lenn + lenp + 2)) {
	ret = xmlMalloc(lenn + lenp + 2);
	if (ret == NULL)
	    return(NULL);
    } else {
	ret = memory;
    }
    memcpy(&ret[0], prefix, lenp);
    ret[lenp] = ':';
    memcpy(&ret[lenp + 1], ncname, lenn);
    ret[lenn + lenp + 1] = 0;
    return(ret);
}